

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_yoda_tests.cpp
# Opt level: O3

void __thiscall
iu_NoYodaTest_x_iutest_x_DoubleEq_Test::Body(iu_NoYodaTest_x_iutest_x_DoubleEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  TestFlag TVar4;
  TestPartResultReporterInterface *pTVar5;
  bool bVar6;
  TestFlag *pTVar7;
  Variable *pVVar8;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  allocator<char> local_275;
  TestFlag local_274;
  SPIFailureChecker local_270;
  AssertionResult local_238;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_00138760;
  local_270.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_274);
  iutest::internal::CmpHelperFloatingPointEQ<double>(&local_210,"1.0","gd",1.0,gd);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_275);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x38;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar1 = &local_210.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar4.m_test_flags = local_274.m_test_flags;
  pTVar7 = iutest::TestFlag::GetInstance();
  pTVar7->m_test_flags = TVar4.m_test_flags;
  pcVar3 = local_1b8 + 0x10;
  local_1b8._16_5_ = 0x6365707845;
  local_1b8._21_3_ = 0x646574;
  local_1b8._24_5_ = 0x302e31203a;
  local_1b8._8_8_ = 0xd;
  local_1b8[0x1d] = '\0';
  local_1b8._0_8_ = pcVar3;
  iutest::detail::SPIFailureChecker::GetResult(&local_238,&local_270,(string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar3) {
    operator_delete((void *)local_1b8._0_8_,CONCAT35(local_1b8._21_3_,local_1b8._16_5_) + 1);
  }
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_001387d0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar5 = local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_001387f8;
  pVVar8 = iutest::TestEnv::get_vars();
  bVar6 = local_238.m_result;
  pVVar8->m_testpartresult_reporter = pTVar5;
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e8);
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x12c1b3;
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x200000038;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_270,(Fixed *)local_1b8,false);
    if (local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_270.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar2 = &local_238.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar6 != false) {
    iutest::detail::NewTestPartResultCheckHelper::
    Collector<iutest::detail::NoTestPartResultReporter>::Collector
              (&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>);
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
    super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (TestPartResultReporterInterface)&PTR__Collector_00138760;
    local_270.m_Type = kNonFatalFailure;
    iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_274);
    iutest::internal::CmpHelperFloatingPointEQ<double>(&local_210,"1.0","gd",1.0,gd);
    if (local_210.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_275);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x39;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = iutest::TestFlag::GetInstance();
    pTVar7->m_test_flags = local_274.m_test_flags;
    local_1b8._16_5_ = 0x6365707845;
    local_1b8._21_3_ = 0x646574;
    local_1b8._24_5_ = 0x302e31203a;
    local_1b8._8_8_ = 0xd;
    local_1b8[0x1d] = '\0';
    local_1b8._0_8_ = pcVar3;
    iutest::detail::SPIFailureChecker::GetResult(&local_238,&local_270,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar3) {
      operator_delete((void *)local_1b8._0_8_,CONCAT35(local_1b8._21_3_,local_1b8._16_5_) + 1);
    }
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
    super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (TestPartResultReporterInterface)&PTR__Collector_001387d0;
    std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
              (&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
    pTVar5 = local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
    _vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_001387f8;
    pVVar8 = iutest::TestEnv::get_vars();
    pVVar8->m_testpartresult_reporter = pTVar5;
    if (local_238.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,local_238.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_1e8);
      local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x12c1b3;
      local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x200000039;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_270,(Fixed *)local_1b8,false);
      if (local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
          super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface !=
          (TestPartResultReporterInterface)
          &local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
        operator_delete((void *)local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
                                super_NoTestPartResultReporter.super_TestPartResultReporterInterface
                                ._vptr_TestPartResultReporterInterface,
                        (ulong)((long)&(local_270.
                                        super_Collector<iutest::detail::NoTestPartResultReporter>.
                                        m_holder.m_origin)->_vptr_TestPartResultReporterInterface +
                               1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_238.m_message._M_dataplus._M_p,
                      local_238.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(NoYodaTest, DoubleEq)
{
    IUTEST_ASSERT_FATAL_FAILURE   ( IUTEST_ASSERT_DOUBLE_EQ(gd, 1.0), "Expected: 1.0" );
    IUTEST_ASSERT_NONFATAL_FAILURE( IUTEST_EXPECT_DOUBLE_EQ(gd, 1.0), "Expected: 1.0" );
}